

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

bool FileStream_Read(TFileStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,DWORD dwBytesToRead)

{
  bool bVar1;
  
  if (pStream->StreamRead != (STREAM_READ)0x0) {
    bVar1 = (*pStream->StreamRead)(pStream,pByteOffset,pvBuffer,dwBytesToRead);
    return bVar1;
  }
  __assert_fail("pStream->StreamRead != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                ,0xa1c,"bool FileStream_Read(TFileStream *, ULONGLONG *, void *, DWORD)");
}

Assistant:

bool FileStream_Read(TFileStream * pStream, ULONGLONG * pByteOffset, void * pvBuffer, DWORD dwBytesToRead)
{
    //FILE * fp = fopen("E:\\Loading.txt", "at");
    //if(fp != NULL)
    //{
    //    ULONGLONG ByteOffset = (pByteOffset != NULL) ? pByteOffset[0] : 0;
    //    fprintf(fp, "%-32ws\t%08X\t%08X\n", GetPlainFileName(pStream->szFileName), (ULONG)ByteOffset, dwBytesToRead);
    //    fclose(fp);
    //}

    assert(pStream->StreamRead != NULL);
    return pStream->StreamRead(pStream, pByteOffset, pvBuffer, dwBytesToRead);
}